

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticAnalyzer.cpp
# Opt level: O3

void __thiscall
SemanticAnalyzerRun::onEnterDeclareStatementAstNode
          (SemanticAnalyzerRun *this,DeclareStatementAstNode *node)

{
  Scope *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  string local_78;
  undefined1 local_58 [8];
  optional<VariableDefinition> originalDeclare;
  
  Scope::findLocally((optional<VariableDefinition> *)local_58,
                     (this->currentScope).super___shared_ptr<Scope,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr,&((node->identifier).
                              super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->value,
                     false);
  if (originalDeclare.super__Optional_base<VariableDefinition,_false,_false>._M_payload.
      super__Optional_payload<VariableDefinition,_true,_false,_false>.
      super__Optional_payload_base<VariableDefinition>._M_payload._M_value.isFullyBound == true) {
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_78,"Duplicate identifier found within same scope.","");
    reportError(this,&node->identifier,&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    this_00 = (this->currentScope).super___shared_ptr<Scope,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    originalDeclare.super__Optional_base<VariableDefinition,_false,_false>._M_payload.
    super__Optional_payload<VariableDefinition,_true,_false,_false>.
    super__Optional_payload_base<VariableDefinition>._24_8_ =
         (node->identifier).super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    this_01 = (node->identifier).super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi;
    if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_01->_M_use_count = this_01->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_01->_M_use_count = this_01->_M_use_count + 1;
      }
    }
    Scope::define(this_00,(string *)
                          originalDeclare.super__Optional_base<VariableDefinition,_false,_false>.
                          _M_payload.super__Optional_payload<VariableDefinition,_true,_false,_false>
                          .super__Optional_payload_base<VariableDefinition>._24_8_,
                  (shared_ptr<Token> *)
                  &originalDeclare.super__Optional_base<VariableDefinition,_false,_false>._M_payload
                   .super__Optional_payload<VariableDefinition,_true,_false,_false>.
                   super__Optional_payload_base<VariableDefinition>._M_engaged,false);
    if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
    }
  }
  if (originalDeclare.super__Optional_base<VariableDefinition,_false,_false>._M_payload.
      super__Optional_payload<VariableDefinition,_true,_false,_false>.
      super__Optional_payload_base<VariableDefinition>._M_payload._M_value.isFullyBound == true) {
    originalDeclare.super__Optional_base<VariableDefinition,_false,_false>._M_payload.
    super__Optional_payload<VariableDefinition,_true,_false,_false>.
    super__Optional_payload_base<VariableDefinition>._M_payload._M_value.isFullyBound = false;
    if (originalDeclare.super__Optional_base<VariableDefinition,_false,_false>._M_payload.
        super__Optional_payload<VariableDefinition,_true,_false,_false>.
        super__Optional_payload_base<VariableDefinition>._M_payload._M_value.token.
        super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 originalDeclare.super__Optional_base<VariableDefinition,_false,_false>._M_payload.
                 super__Optional_payload<VariableDefinition,_true,_false,_false>.
                 super__Optional_payload_base<VariableDefinition>._M_payload._M_value.token.
                 super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    }
  }
  return;
}

Assistant:

void onEnterDeclareStatementAstNode(DeclareStatementAstNode* node) noexcept override {
    auto originalDeclare = this->currentScope->findLocally(node->identifier->value, false);
    if (originalDeclare != std::nullopt) {
      this->reportError(node->identifier, "Duplicate identifier found within same scope.");
    } else {
      // paritally define (late bound available) variable for current scope
      this->currentScope->define(node->identifier->value, node->identifier, false);
    }
  }